

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifoph(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  int iVar2;
  runsdef *prVar3;
  runcxdef *prVar4;
  int output_occurred;
  runsdef val;
  int hidden;
  int local_2c;
  runsdef local_28;
  int local_14;
  
  outstat(&local_14,&local_2c);
  prVar4 = ctx->bifcxrun;
  uVar1 = prVar4->runcxsp[-1].runstyp;
  prVar3 = prVar4->runcxsp + -1;
  if (uVar1 == '\x01') {
    prVar4->runcxsp = prVar3;
    prVar4 = ctx->bifcxrun;
    if (prVar3->runstyp != '\x01') {
      prVar4->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    iVar2 = *(int *)&prVar4->runcxsp->runsv;
    if (iVar2 == 2) {
      runpush(prVar4,(uint)(local_2c != 0) * 3 + 5,&local_28);
      outsethidden();
      return;
    }
    if (iVar2 != 1) {
      if (iVar2 != 0) {
        ctx->bifcxerr->errcxptr->erraav[0].errastr = "outhide";
        ctx->bifcxerr->errcxptr->erraac = 1;
        errsign(ctx->bifcxerr,0x400,"TADS");
      }
      local_2c = outshow();
    }
  }
  else {
    if (uVar1 != '\x05') {
      if (uVar1 == '\b') {
        prVar4->runcxsp = prVar3;
        if (local_14 == 0) {
          local_28.runsv.runsvnum = 0;
        }
        else if (local_2c == 0) {
          local_28.runsv.runsvnum = 1;
        }
        else {
          local_28.runsv.runsvnum = 2;
        }
        runpush(ctx->bifcxrun,1,&local_28);
        outhide();
        return;
      }
      errsigf(ctx->bifcxerr,"TADS",0x3eb);
    }
    prVar4->runcxsp = prVar3;
    prVar4 = ctx->bifcxrun;
    local_2c = outshow();
  }
  runpush(prVar4,(uint)(local_2c != 0) * 3 + 5,&local_28);
  return;
}

Assistant:

void bifoph(bifcxdef *ctx, int argc)
{
    runsdef val;
    int     hidden, output_occurred;

    bifcntargs(ctx, 1, argc);
    outstat(&hidden, &output_occurred);
    if (runtostyp(ctx->bifcxrun) == DAT_TRUE)
    {
        /* throw away the flag */
        rundisc(ctx->bifcxrun);
        
        /* figure out appropriate return value */
        if (!hidden)
            val.runsv.runsvnum = 0;
        else if (!output_occurred)
            val.runsv.runsvnum = 1;
        else
            val.runsv.runsvnum = 2;
        runpush(ctx->bifcxrun, DAT_NUMBER, &val);

        /* actually hide the output, resetting count flag */
        outhide();
    }
    else if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        /* throw away the flag */
        rundisc(ctx->bifcxrun);

        /* show output, returning status */
        runpush(ctx->bifcxrun, runclog(outshow()), &val);
    }
    else if (runtostyp(ctx->bifcxrun) == DAT_NUMBER)
    {
        int n = runpopnum(ctx->bifcxrun);

        if (n == 0)
        {
            /* output was not hidden - show output and return status */
            runpush(ctx->bifcxrun, runclog(outshow()), &val);
        }
        else if (n == 1)
        {
            /*
             *   Output was hidden, but no output had occurred yet.
             *   Leave output hidden and return whether any output has
             *   occurred.
             */
            runpush(ctx->bifcxrun, runclog(output_occurred), &val);
        }
        else if (n == 2)
        {
            /*
             *   Output was hidden, and output had already occurred.  If
             *   more output has occurred, return true, else return nil.
             *   In either case, set the output_occurred flag back to
             *   true, since it was true before the outhide(true).  
             */
            runpush(ctx->bifcxrun, runclog(output_occurred), &val);
            outsethidden();
        }
        else
            errsig1(ctx->bifcxerr, ERR_INVVBIF, ERRTSTR, "outhide");
    }
    else
        errsig(ctx->bifcxerr, ERR_REQNUM);
}